

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O1

void ly_in_free(ly_in *in,ly_bool destroy)

{
  LY_IN_TYPE LVar1;
  char *addr;
  
  if (in == (ly_in *)0x0) {
    return;
  }
  LVar1 = in->type;
  if (LVar1 == LY_IN_ERROR) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/in.c",0x10c);
    return;
  }
  if (destroy == '\0') {
    if (LVar1 == LY_IN_MEMORY) goto LAB_00167ede;
    ly_munmap(in->start,in->length);
    if (in->type != LY_IN_FILEPATH) goto LAB_00167ede;
    close((in->method).fd);
LAB_00167ed5:
    addr = (in->method).fpath.filepath;
  }
  else {
    addr = in->start;
    if (LVar1 != LY_IN_MEMORY) {
      ly_munmap(addr,in->length);
      if (in->type == LY_IN_FILE) {
        fclose((FILE *)(in->method).f);
        goto LAB_00167ede;
      }
      close((in->method).fd);
      if (in->type != LY_IN_FILEPATH) goto LAB_00167ede;
      goto LAB_00167ed5;
    }
  }
  free(addr);
LAB_00167ede:
  free(in);
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_in_free(struct ly_in *in, ly_bool destroy)
{
    if (!in) {
        return;
    } else if (in->type == LY_IN_ERROR) {
        LOGINT(NULL);
        return;
    }

    if (destroy) {
        if (in->type == LY_IN_MEMORY) {
            free((char *)in->start);
        } else {
            ly_munmap((char *)in->start, in->length);

            if (in->type == LY_IN_FILE) {
                fclose(in->method.f);
            } else {
                close(in->method.fd);

                if (in->type == LY_IN_FILEPATH) {
                    free(in->method.fpath.filepath);
                }
            }
        }
    } else if (in->type != LY_IN_MEMORY) {
        ly_munmap((char *)in->start, in->length);

        if (in->type == LY_IN_FILEPATH) {
            close(in->method.fpath.fd);
            free(in->method.fpath.filepath);
        }
    }

    free(in);
}